

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

ostream_t * el::base::utils::operator<<(ostream_t *os,CommandLineArgs *c)

{
  char *__s;
  size_t sVar1;
  long lVar2;
  
  if (1 < c->m_argc) {
    lVar2 = 1;
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"[",1);
      __s = c->m_argv[lVar2];
      if (__s == (char *)0x0) {
        ::std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
      }
      else {
        sVar1 = strlen(__s);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,__s,sVar1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"]",1);
      if (lVar2 < (long)c->m_argc + -1) {
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)os," ",1);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < c->m_argc);
  }
  return os;
}

Assistant:

base::type::ostream_t& operator<<(base::type::ostream_t& os, const CommandLineArgs& c) {
  for (int i = 1; i < c.m_argc; ++i) {
    os << ELPP_LITERAL("[") << c.m_argv[i] << ELPP_LITERAL("]");
    if (i < c.m_argc - 1) {
      os << ELPP_LITERAL(" ");
    }
  }
  return os;
}